

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O1

bool __thiscall
Clasp::ShortImplicationsGraph::add(ShortImplicationsGraph *this,ImpType t,bool learnt,Literal *lits)

{
  pointer pIVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  undefined7 in_register_00000011;
  size_t sVar5;
  size_t extraout_RDX;
  Literal LVar6;
  undefined8 uVar7;
  void *__ptr;
  pointer pIVar8;
  Literal r;
  Literal q;
  Literal p;
  Literal local_3c;
  left_type local_38;
  uint local_34;
  
  sVar5 = CONCAT71(in_register_00000011,learnt);
  uVar4 = sVar5 & 0xffffffff;
  uVar3 = lits->rep_;
  r.rep_ = 2;
  if (t == ternary_imp) {
    r.rep_ = lits[2].rep_ & 0xfffffffe;
  }
  local_38.rep_ = uVar3 & 0xfffffffe;
  local_3c.rep_ = lits[1].rep_ & 0xfffffffe;
  __ptr = (void *)(ulong)local_3c.rep_;
  if (this->shared_ == false) {
    local_34 = (uint)sVar5;
    LVar6.rep_ = r.rep_;
    if ((char)uVar4 != '\0') {
      local_38.rep_ = uVar3 | 1;
      local_3c.rep_ = lits[1].rep_ | 1;
      LVar6.rep_ = r.rep_ | 1;
    }
    pIVar8 = (this->graph_).ebo_.buf + ((ulong)(local_38.rep_ >> 1) ^ 1);
    if (t == binary_imp) {
      bk_lib::detail::left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>::
      push_left((left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_> *)pIVar8
                ,&local_3c);
      bk_lib::detail::left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>::
      push_left((left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_> *)
                ((this->graph_).ebo_.buf + ((ulong)(local_3c.rep_ >> 1) ^ 1)),&local_38);
    }
    else {
      uVar7 = CONCAT44(LVar6.rep_,local_3c.rep_);
      if ((ulong)(pIVar8->super_ImpListBase).super_type.
                 super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.
                 right_ <
          (ulong)(pIVar8->super_ImpListBase).super_type.
                 super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.
                 left_ + 8) {
        bk_lib::detail::left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>::
        realloc((left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_> *)pIVar8
                ,__ptr,sVar5);
      }
      uVar3 = (pIVar8->super_ImpListBase).super_type.
              super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.
              right_ - 8;
      (pIVar8->super_ImpListBase).super_type.
      super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.right_ =
           uVar3;
      *(undefined8 *)
       ((pIVar8->super_ImpListBase).super_type.
        super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.buf_ +
       uVar3) = uVar7;
      uVar4 = (ulong)(local_3c.rep_ >> 1) ^ 1;
      pIVar1 = (this->graph_).ebo_.buf;
      pIVar8 = pIVar1 + uVar4;
      uVar7 = CONCAT44(LVar6.rep_,local_38.rep_);
      sVar5 = (ulong)pIVar1[uVar4].super_ImpListBase.super_type.
                     super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>
                     .left_ + 8;
      if (pIVar1[uVar4].super_ImpListBase.super_type.
          super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.right_ <
          sVar5) {
        bk_lib::detail::left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>::
        realloc((left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_> *)pIVar8
                ,__ptr,sVar5);
        sVar5 = extraout_RDX;
      }
      uVar3 = (pIVar8->super_ImpListBase).super_type.
              super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.
              right_ - 8;
      (pIVar8->super_ImpListBase).super_type.
      super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.right_ =
           uVar3;
      *(undefined8 *)
       ((pIVar8->super_ImpListBase).super_type.
        super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.buf_ +
       uVar3) = uVar7;
      uVar3 = r.rep_ >> 1 ^ 1;
      pIVar1 = (this->graph_).ebo_.buf;
      pIVar8 = pIVar1 + uVar3;
      uVar7 = CONCAT44(local_3c.rep_,local_38.rep_);
      if ((ulong)pIVar1[uVar3].super_ImpListBase.super_type.
                 super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.
                 right_ <
          (ulong)pIVar1[uVar3].super_ImpListBase.super_type.
                 super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.
                 left_ + 8) {
        bk_lib::detail::left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>::
        realloc((left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_> *)pIVar8
                ,__ptr,sVar5);
      }
      uVar3 = (pIVar8->super_ImpListBase).super_type.
              super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.
              right_ - 8;
      (pIVar8->super_ImpListBase).super_type.
      super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.right_ =
           uVar3;
      *(undefined8 *)
       ((pIVar8->super_ImpListBase).super_type.
        super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.buf_ +
       uVar3) = uVar7;
    }
    uVar4 = (ulong)local_34;
LAB_0015fd15:
    this->bin_[(ulong)(t == ternary_imp) * 2 + uVar4] =
         this->bin_[(ulong)(t == ternary_imp) * 2 + uVar4] + 1;
    bVar2 = true;
  }
  else {
    if ((char)uVar4 != '\0') {
      bVar2 = ImplicationList::hasLearnt
                        ((this->graph_).ebo_.buf + ((ulong)(uVar3 >> 1) ^ 1),local_3c,r);
      if (!bVar2) {
        ImplicationList::addLearnt
                  ((this->graph_).ebo_.buf + ((ulong)(local_38.rep_ >> 1) ^ 1),local_3c,r);
        ImplicationList::addLearnt
                  ((this->graph_).ebo_.buf + ((ulong)(local_3c.rep_ >> 1) ^ 1),
                   (Literal)local_38.rep_,r);
        if (t == ternary_imp) {
          ImplicationList::addLearnt
                    ((this->graph_).ebo_.buf + (r.rep_ >> 1 ^ 1),(Literal)local_38.rep_,local_3c);
        }
        goto LAB_0015fd15;
      }
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool ShortImplicationsGraph::add(ImpType t, bool learnt, const Literal* lits) {
	uint32& stats= (t == ternary_imp ? tern_ : bin_)[learnt];
	Literal p = lits[0], q = lits[1], r = (t == ternary_imp ? lits[2] : lit_false());
	p.unflag(), q.unflag(), r.unflag();
	if (!shared_) {
		if (learnt) { p.flag(), q.flag(), r.flag(); }
		if (t == binary_imp) {
			getList(~p).push_left(q);
			getList(~q).push_left(p);
		}
		else {
			getList(~p).push_right(std::make_pair(q, r));
			getList(~q).push_right(std::make_pair(p, r));
			getList(~r).push_right(std::make_pair(p, q));
		}
		++stats;
		return true;
	}
#if CLASP_HAS_THREADS
	else if (learnt && !getList(~p).hasLearnt(q, r)) {
		getList(~p).addLearnt(q, r);
		getList(~q).addLearnt(p, r);
		if (t == ternary_imp) {
			getList(~r).addLearnt(p, q);
		}
		++stats;
		return true;
	}
#endif
	return false;
}